

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O0

void empty_port::impl<(empty_port::Kind)0>::fill_struct
               (socket_t *param_1,sockaddr_in *addr,port_t port,char *host)

{
  uint16_t uVar1;
  runtime_error *this;
  char *__rhs;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_6c;
  long lStack_68;
  int r;
  sockaddr_in *host_addr;
  addrinfo *result;
  addrinfo hints;
  char *host_local;
  port_t port_local;
  sockaddr_in *addr_local;
  socket_t *param_0_local;
  
  hints.ai_next = (addrinfo *)host;
  memset(addr,0,0x10);
  addr->sin_family = 2;
  uVar1 = htons(port);
  addr->sin_port = uVar1;
  host_addr = (sockaddr_in *)0x0;
  memset(&result,0,0x30);
  result._4_4_ = 2;
  hints.ai_flags = 1;
  local_6c = getaddrinfo((char *)hints.ai_next,(char *)0x0,(addrinfo *)&result,
                         (addrinfo **)&host_addr);
  if (local_6c != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"Cannot getaddrinfo:: ",&local_b1);
    __rhs = strerror(local_6c);
    std::operator+(&local_90,&local_b0,__rhs);
    std::runtime_error::runtime_error(this,(string *)&local_90);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lStack_68 = *(long *)host_addr[1].sin_zero;
  (addr->sin_addr).s_addr = *(in_addr_t *)(lStack_68 + 4);
  freeaddrinfo((addrinfo *)host_addr);
  return;
}

Assistant:

inline void impl<TCP>::fill_struct(const socket_t & /*socket*/, sockaddr_in &addr,
                                   const port_t port, const char *host) {
    std::memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);

    struct addrinfo hints, *result = NULL;
    std::memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_INET;
    hints.ai_socktype = SOCK_STREAM;

    struct sockaddr_in *host_addr;
    // looks up IPv4/IPv6 address by host name or stringized IP address
    int r = getaddrinfo(host, NULL, &hints, &result);
    if (r) {
        throw std::runtime_error(std::string("Cannot getaddrinfo:: ") +
                                 strerror(r));
    }
    host_addr = (struct sockaddr_in *)result->ai_addr;
    memcpy(&addr.sin_addr, &host_addr->sin_addr, sizeof(struct in_addr));
    freeaddrinfo(result);
}